

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ConstantDerivateCase::ConstantDerivateCase
          (ConstantDerivateCase *this,Context *context,char *name,char *description,
          DerivateFunc func,DataType type)

{
  DataType type_local;
  DerivateFunc func_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  ConstantDerivateCase *this_local;
  
  TriangleDerivateCase::TriangleDerivateCase
            (&this->super_TriangleDerivateCase,context,name,description);
  (this->super_TriangleDerivateCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ConstantDerivateCase_0329f768;
  *(DerivateFunc *)&(this->super_TriangleDerivateCase).field_0xf4 = func;
  (this->super_TriangleDerivateCase).m_dataType = type;
  (this->super_TriangleDerivateCase).m_precision = PRECISION_HIGHP;
  (this->super_TriangleDerivateCase).m_coordDataType = (this->super_TriangleDerivateCase).m_dataType
  ;
  (this->super_TriangleDerivateCase).m_coordPrecision =
       (this->super_TriangleDerivateCase).m_precision;
  return;
}

Assistant:

ConstantDerivateCase::ConstantDerivateCase (Context& context, const char* name, const char* description, DerivateFunc func, glu::DataType type)
	: TriangleDerivateCase	(context, name, description)
	, m_func				(func)
{
	m_dataType			= type;
	m_precision			= glu::PRECISION_HIGHP;
	m_coordDataType		= m_dataType;
	m_coordPrecision	= m_precision;
}